

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcChamferEdgeFeature::IfcChamferEdgeFeature(IfcChamferEdgeFeature *this)

{
  *(undefined ***)&this->field_0x1a8 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x1b0 = 0;
  *(char **)&this->field_0x1b8 = "IfcChamferEdgeFeature";
  Schema_2x3::IfcEdgeFeature::IfcEdgeFeature
            (&this->super_IfcEdgeFeature,&PTR_construction_vtable_24__00750728);
  *(undefined8 *)&(this->super_IfcEdgeFeature).field_0x180 = 0;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x7505a8;
  *(undefined8 *)&this->field_0x1a8 = 0x750710;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x7505d0;
  (this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7505f8;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x750620;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x750648;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x138 = 0x750670;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x148 = 0x750698;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    field_0x158 = 0x7506c0;
  *(undefined8 *)&(this->super_IfcEdgeFeature).field_0x178 = 0x7506e8;
  this->field_0x190 = 0;
  (this->Height).have = false;
  return;
}

Assistant:

IfcChamferEdgeFeature() : Object("IfcChamferEdgeFeature") {}